

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall JsonObject_BadNestedObject_Test::TestBody(JsonObject_BadNestedObject_Test *this)

{
  bool bVar1;
  parser<pstore::json::null_output> *this_00;
  error_code *lhs;
  char *message;
  error_code eVar2;
  AssertHelper local_118;
  Message local_110;
  error_code local_108;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  allocator local_d1;
  string local_d0;
  undefined1 local_a8 [8];
  parser<pstore::json::null_output> p;
  JsonObject_BadNestedObject_Test *this_local;
  
  p.coordinate_ = (coord)this;
  pstore::json::parser<pstore::json::null_output>::parser
            ((parser<pstore::json::null_output> *)local_a8,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"{\"a\":nu}",&local_d1);
  this_00 = pstore::json::parser<pstore::json::null_output>::input
                      ((parser<pstore::json::null_output> *)local_a8,&local_d0);
  pstore::json::parser<pstore::json::null_output>::eof(this_00);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  lhs = pstore::json::parser<pstore::json::null_output>::last_error
                  ((parser<pstore::json::null_output> *)local_a8);
  eVar2 = pstore::json::make_error_code(unrecognized_token);
  local_108._M_cat = eVar2._M_cat;
  local_108._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_f8,"p.last_error ()",
             "make_error_code (json::error_code::unrecognized_token)",lhs,&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pstore::json::parser<pstore::json::null_output>::~parser
            ((parser<pstore::json::null_output> *)local_a8);
  return;
}

Assistant:

TEST_F (JsonObject, BadNestedObject) {
    json::parser<json::null_output> p;
    p.input (std::string{"{\"a\":nu}"}).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unrecognized_token));
}